

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O1

_Bool mi_heap_buf_expand(mi_heap_buf_t *hbuf)

{
  size_t sVar1;
  char *pcVar2;
  size_t newsize;
  _Bool _Var3;
  
  if (hbuf != (mi_heap_buf_t *)0x0) {
    if ((hbuf->buf != (char *)0x0) && (hbuf->size != 0)) {
      hbuf->buf[hbuf->size - 1] = '\0';
    }
    sVar1 = hbuf->size;
    if (((long)sVar1 < 0) || (hbuf->can_realloc != true)) {
      _Var3 = false;
    }
    else {
      newsize = 0x800;
      if (sVar1 != 0) {
        newsize = sVar1 * 2;
      }
      pcVar2 = (char *)mi_rezalloc(hbuf->buf,newsize);
      _Var3 = pcVar2 != (char *)0x0;
      if (_Var3) {
        hbuf->buf = pcVar2;
        hbuf->size = newsize;
        _Var3 = true;
      }
    }
    return _Var3;
  }
  return false;
}

Assistant:

static bool mi_heap_buf_expand(mi_heap_buf_t* hbuf) {
  if (hbuf==NULL) return false;
  if (hbuf->buf != NULL && hbuf->size>0) {
    hbuf->buf[hbuf->size-1] = 0;
  }
  if (hbuf->size > SIZE_MAX/2 || !hbuf->can_realloc) return false;
  const size_t newsize = (hbuf->size == 0 ? 2*MI_KiB : 2*hbuf->size);
  char* const  newbuf  = (char*)mi_rezalloc(hbuf->buf, newsize);
  if (newbuf == NULL) return false;
  hbuf->buf = newbuf;
  hbuf->size = newsize;
  return true;
}